

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

void __thiscall
lest::failure::failure(failure *this,location *where_,text *expr_,text *decomposition_)

{
  allocator local_132;
  allocator local_131;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  size_type local_128;
  char local_120 [8];
  undefined8 uStack_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  size_type local_e8;
  char local_e0 [8];
  undefined8 uStack_d8;
  text local_d0;
  text local_b0;
  text local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  location local_50;
  
  std::__cxx11::string::string((string *)&local_f0,"failed",&local_131);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  if (local_f0 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0) {
    local_b0.field_2._8_8_ = uStack_d8;
  }
  else {
    local_b0._M_dataplus._M_p = (pointer)local_f0;
  }
  local_b0._M_string_length = local_e8;
  local_e8 = 0;
  local_e0[0] = '\0';
  local_f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_e0;
  location::location(&local_50,where_);
  std::operator+(&local_70,expr_," for ");
  std::operator+(&local_110,&local_70,decomposition_);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p == &local_110.field_2) {
    local_d0.field_2._8_8_ = local_110.field_2._8_8_;
  }
  else {
    local_d0._M_dataplus._M_p = local_110._M_dataplus._M_p;
  }
  local_d0._M_string_length = local_110._M_string_length;
  local_110._M_string_length = 0;
  local_110.field_2._M_local_buf[0] = '\0';
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::string((string *)&local_130,"",&local_132);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  if (local_130 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120) {
    local_90.field_2._8_8_ = uStack_118;
  }
  else {
    local_90._M_dataplus._M_p = (pointer)local_130;
  }
  local_90._M_string_length = local_128;
  local_128 = 0;
  local_120[0] = '\0';
  local_130 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120;
  message::message(&this->super_message,&local_b0,&local_50,&local_d0,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_f0);
  *(undefined ***)&this->super_message = &PTR__message_0012ac50;
  return;
}

Assistant:

failure( location where_, text expr_, text decomposition_)
    : message( "failed", where_, expr_ + " for " + decomposition_) {}